

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  byte bVar5;
  mbedtls_mpi_uint d;
  ulong local_50;
  mbedtls_mpi T;
  
  iVar1 = -4;
  if (0xfffffff0 < radix - 0x11U) {
    T.s = 1;
    T.n = 0;
    T.p = (mbedtls_mpi_uint *)0x0;
    sVar2 = strlen(s);
    if (radix == 0x10) {
      if (sVar2 >> 0x3e != 0) {
        return -4;
      }
      iVar1 = mbedtls_mpi_grow(X,((sVar2 >> 4) + 1) - (ulong)((sVar2 & 0xf) == 0));
      if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_lset(X,0), iVar1 == 0)) {
        bVar5 = 0;
        uVar3 = 0;
        do {
          iVar1 = 0;
          if (sVar2 == 1) {
            if (*s == '-') {
              X->s = -1;
              break;
            }
          }
          else if (sVar2 == 0) break;
          iVar1 = mpi_get_digit(&d,0x10,s[sVar2 - 1]);
          if (iVar1 != 0) break;
          X->p[uVar3 >> 4] = X->p[uVar3 >> 4] | d << (bVar5 & 0x3c);
          sVar2 = sVar2 - 1;
          uVar3 = uVar3 + 1;
          bVar5 = bVar5 + 4;
        } while( true );
      }
    }
    else {
      iVar1 = mbedtls_mpi_lset(X,0);
      if (iVar1 == 0) {
        local_50 = (ulong)(uint)radix;
        for (sVar4 = 0; iVar1 = 0, sVar2 != sVar4; sVar4 = sVar4 + 1) {
          if ((sVar4 == 0) && (*s == '-')) {
            X->s = -1;
          }
          else {
            iVar1 = mpi_get_digit(&d,radix,s[sVar4]);
            if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_mul_int(&T,X,local_50), iVar1 != 0)) break;
            if (X->s == 1) {
              iVar1 = mbedtls_mpi_add_int(X,&T,d);
            }
            else {
              iVar1 = mbedtls_mpi_sub_int(X,&T,d);
            }
            if (iVar1 != 0) break;
          }
        }
      }
    }
    mbedtls_mpi_free(&T);
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_read_string( mbedtls_mpi *X, int radix, const char *s )
{
    int ret;
    size_t i, j, slen, n;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &T );

    slen = strlen( s );

    if( radix == 16 )
    {
        if( slen > MPI_SIZE_T_MAX >> 2 )
            return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

        n = BITS_TO_LIMBS( slen << 2 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, n ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

        for( i = slen, j = 0; i > 0; i--, j++ )
        {
            if( i == 1 && s[i - 1] == '-' )
            {
                X->s = -1;
                break;
            }

            MBEDTLS_MPI_CHK( mpi_get_digit( &d, radix, s[i - 1] ) );
            X->p[j / ( 2 * ciL )] |= d << ( ( j % ( 2 * ciL ) ) << 2 );
        }
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

        for( i = 0; i < slen; i++ )
        {
            if( i == 0 && s[i] == '-' )
            {
                X->s = -1;
                continue;
            }

            MBEDTLS_MPI_CHK( mpi_get_digit( &d, radix, s[i] ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T, X, radix ) );

            if( X->s == 1 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, &T, d ) );
            }
            else
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( X, &T, d ) );
            }
        }
    }

cleanup:

    mbedtls_mpi_free( &T );

    return( ret );
}